

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall
cmake::SetArgs(cmake *this,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  size_type sVar1;
  size_type sVar2;
  bool bVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  int iVar5;
  LogLevel LVar6;
  pointer pbVar7;
  long lVar8;
  ulong uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  cmGlobalGenerator *gg;
  undefined8 uVar11;
  string *psVar12;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 uVar13;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  string *psVar14;
  uint uVar15;
  ulong uVar16;
  string kdevError;
  string value;
  string local_108;
  string local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c8;
  ulong local_c0;
  ulong local_b8;
  string *local_b0;
  string *local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a0;
  string *local_98;
  string *local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_c8 = args;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7)) {
    local_b0 = (string *)&this->GeneratorToolset;
    local_a8 = (string *)&this->GeneratorPlatform;
    local_a0 = &this->TraceOnlyThisSources;
    local_98 = (string *)&this->GraphVizFile;
    local_90 = (string *)&this->CheckStampList;
    local_88 = (string *)&this->CheckStampFile;
    local_80 = (string *)&this->CheckBuildSystemArgument;
    local_78 = &this->GeneratorInstance;
    uVar16 = 1;
    local_c0 = 0;
    local_b8 = 0;
LAB_0021d4ee:
    psVar12 = pbVar7 + uVar16;
    lVar8 = std::__cxx11::string::find((char *)psVar12,0x54769f,0);
    uVar15 = (uint)uVar16;
    if ((lVar8 == 0) || (lVar8 = std::__cxx11::string::find((char *)psVar12,0x5476c4,0), lVar8 == 0)
       ) {
      std::__cxx11::string::substr((ulong)&local_e8,(ulong)psVar12);
      if (local_e8._M_string_length == 0) {
        uVar15 = uVar15 + 1;
        if ((ulong)uVar15 <
            (ulong)((long)(local_c8->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_c8->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5)) {
          std::__cxx11::string::_M_assign((string *)&local_e8);
          if (*local_e8._M_dataplus._M_p != '-') goto LAB_0021d8b5;
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_108,"No source directory specified for -S","");
          cmSystemTools::Error(&local_108);
        }
        else {
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_108,"No source directory specified for -S","");
          cmSystemTools::Error(&local_108);
        }
        goto LAB_0021d98c;
      }
LAB_0021d8b5:
      cmsys::SystemTools::CollapseFullPath(&local_108,&local_e8);
      std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,
                        CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                 local_108.field_2._M_local_buf[0]) + 1);
      }
      cmsys::SystemTools::ConvertToUnixSlashes(&local_e8);
      bVar3 = true;
      SetHomeDirectory(this,&local_e8);
LAB_0021da15:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) {
        return;
      }
    }
    else {
      lVar8 = std::__cxx11::string::find((char *)psVar12,0x5476c7,0);
      if (lVar8 == 0) goto LAB_0021da3a;
      lVar8 = std::__cxx11::string::find((char *)psVar12,0x5476eb,0);
      if (lVar8 == 0) {
        std::__cxx11::string::substr((ulong)&local_e8,(ulong)psVar12);
        if (local_e8._M_string_length == 0) {
          uVar15 = uVar15 + 1;
          if ((ulong)uVar15 <
              (ulong)((long)(local_c8->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_c8->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)&local_e8);
            if (*local_e8._M_dataplus._M_p != '-') goto LAB_0021d9ce;
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_108,"No build directory specified for -B","");
            cmSystemTools::Error(&local_108);
          }
          else {
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_108,"No build directory specified for -B","");
            cmSystemTools::Error(&local_108);
          }
          goto LAB_0021d98c;
        }
LAB_0021d9ce:
        cmsys::SystemTools::CollapseFullPath(&local_108,&local_e8);
        std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,
                          CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                   local_108.field_2._M_local_buf[0]) + 1);
        }
        cmsys::SystemTools::ConvertToUnixSlashes(&local_e8);
        bVar3 = true;
        SetHomeOutputDirectory(this,&local_e8);
        goto LAB_0021da15;
      }
      lVar8 = (long)(local_c8->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_c8->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar16 < lVar8 - 2U) {
        lVar8 = std::__cxx11::string::find((char *)psVar12,0x5476ee,0);
        pvVar4 = local_c8;
        if (lVar8 == 0) {
          std::__cxx11::string::_M_assign(local_80);
          uVar15 = uVar15 + 2;
          iVar5 = atoi((pvVar4->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p);
          this->ClearBuildSystem = 0 < iVar5;
          goto LAB_0021da3a;
        }
        lVar8 = (long)(local_c8->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_c8->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5;
      }
      uVar9 = lVar8 - 1;
      if (uVar16 < uVar9) {
        lVar8 = std::__cxx11::string::find((char *)psVar12,0x547703,0);
        psVar14 = local_88;
        if (lVar8 != 0) {
          uVar9 = ((long)(local_c8->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_c8->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
          goto LAB_0021d5f6;
        }
      }
      else {
LAB_0021d5f6:
        if ((uVar9 <= uVar16) ||
           (lVar8 = std::__cxx11::string::find((char *)psVar12,0x547716,0), psVar14 = local_90,
           lVar8 != 0)) {
          lVar8 = std::__cxx11::string::find((char *)psVar12,0x557a92,0);
          if ((lVar8 == 0) ||
             ((lVar8 = std::__cxx11::string::find((char *)psVar12,0x547557,0), lVar8 == 0 ||
              (lVar8 = std::__cxx11::string::find((char *)psVar12,0x53323c,0), lVar8 == 0)))) {
            uVar15 = uVar15 + (psVar12->_M_string_length == 2);
          }
          else {
            lVar8 = std::__cxx11::string::find((char *)psVar12,0x533269,0);
            if ((lVar8 == 0) ||
               (lVar8 = std::__cxx11::string::find((char *)psVar12,0x5475dc,0), lVar8 == 0)) {
              uVar15 = uVar15 + 1;
            }
            else {
              lVar8 = std::__cxx11::string::find((char *)psVar12,0x547509,0);
              if (lVar8 == 0) goto LAB_0021da3a;
              lVar8 = std::__cxx11::string::find((char *)psVar12,0x547729,0);
              if (lVar8 == 0) {
                std::__cxx11::string::substr((ulong)&local_e8,(ulong)psVar12);
                cmsys::SystemTools::CollapseFullPath(&local_108,&local_e8);
                std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_108);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                           local_108.field_2._M_local_buf[0]) + 1);
                }
                cmsys::SystemTools::ConvertToUnixSlashes(&local_e8);
                std::__cxx11::string::_M_assign(local_98);
                if ((this->GraphVizFile)._M_string_length == 0) {
                  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_108,"No file specified for --graphviz","");
                  cmSystemTools::Error(&local_108);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108._M_dataplus._M_p != &local_108.field_2) {
                    operator_delete(local_108._M_dataplus._M_p,
                                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                             local_108.field_2._M_local_buf[0]) + 1);
                  }
                  goto LAB_0021e2f9;
                }
LAB_0021dc6f:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                lVar8 = std::__cxx11::string::find((char *)psVar12,0x547756,0);
                if (lVar8 == 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"debug trycompile on\n",0x14);
                  this->DebugTryCompile = true;
                }
                else {
                  lVar8 = std::__cxx11::string::find((char *)psVar12,0x54777e,0);
                  if (lVar8 == 0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Running with debug output on.\n",0x1e);
                    this->DebugOutput = true;
                  }
                  else {
                    lVar8 = std::__cxx11::string::find((char *)psVar12,0x5477ac,0);
                    if (lVar8 == 0) {
                      std::__cxx11::string::substr((ulong)&local_e8,(ulong)psVar12);
                      LVar6 = StringToLogLevel(&local_e8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                        operator_delete(local_e8._M_dataplus._M_p,
                                        local_e8.field_2._M_allocated_capacity + 1);
                      }
                      if (LVar6 == LOG_UNDEFINED) {
                        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_e8,"Invalid level specified for --loglevel","");
                        cmSystemTools::Error(&local_e8);
                        goto LAB_0021e2f9;
                      }
                      this->MessageLogLevel = LVar6;
                    }
                    else {
                      lVar8 = std::__cxx11::string::find((char *)psVar12,0x5331f8,0);
                      if (lVar8 == 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"Running with expanded trace output on.\n",
                                   0x27);
                        this->Trace = true;
                        this->TraceExpand = true;
                      }
                      else {
                        lVar8 = std::__cxx11::string::find((char *)psVar12,0x547807,0);
                        if (lVar8 == 0) {
                          std::__cxx11::string::substr((ulong)&local_e8,(ulong)psVar12);
                          cmsys::SystemTools::ConvertToUnixSlashes(&local_e8);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back(local_a0,&local_e8);
                          this->Trace = true;
                          goto LAB_0021dc6f;
                        }
                        lVar8 = std::__cxx11::string::find((char *)psVar12,0x5331c4,0);
                        if (lVar8 == 0) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"Running with trace output on.\n",0x1e);
                          this->Trace = true;
                          this->TraceExpand = false;
                        }
                        else {
                          lVar8 = std::__cxx11::string::find((char *)psVar12,0x547836,0);
                          if (lVar8 == 0) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,"Warn about uninitialized values.\n",
                                       0x21);
                            this->WarnUninitialized = true;
                          }
                          else {
                            lVar8 = std::__cxx11::string::find((char *)psVar12,0x54786d,0);
                            if (lVar8 == 0) {
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,"Finding unused variables.\n",0x1a);
                              this->WarnUnused = true;
                            }
                            else {
                              lVar8 = std::__cxx11::string::find((char *)psVar12,0x54789b,0);
                              if (lVar8 == 0) {
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,
                                           "Not searching for unused variables given on the ",0x30);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,"command line.\n",0xe);
                                this->WarnUnusedCli = false;
                              }
                              else {
                                lVar8 = std::__cxx11::string::find((char *)psVar12,0x5478f0,0);
                                if (lVar8 != 0) {
                                  lVar8 = std::__cxx11::string::find((char *)psVar12,0x54796f,0);
                                  if (lVar8 == 0) {
                                    std::__cxx11::string::substr((ulong)&local_e8,(ulong)psVar12);
                                    if (local_e8._M_string_length == 0) {
                                      uVar15 = uVar15 + 1;
                                      if ((ulong)((long)(local_c8->
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(local_c8->
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 5)
                                          <= (ulong)uVar15) {
                                        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_108,
                                                   "No platform specified for -A","");
                                        cmSystemTools::Error(&local_108);
LAB_0021d98c:
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_108._M_dataplus._M_p != &local_108.field_2) {
                                          operator_delete(local_108._M_dataplus._M_p,
                                                          CONCAT71(local_108.field_2.
                                                                   _M_allocated_capacity._1_7_,
                                                                   local_108.field_2._M_local_buf[0]
                                                                  ) + 1);
                                        }
                                        goto LAB_0021d9a7;
                                      }
                                      std::__cxx11::string::_M_assign((string *)&local_e8);
                                    }
                                    if ((local_b8 & 1) == 0) {
                                      uVar11 = std::__cxx11::string::_M_assign(local_a8);
                                      this->GeneratorPlatformSet = true;
                                      bVar3 = true;
                                      local_b8 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
                                      goto LAB_0021da15;
                                    }
                                    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_108,
                                               "Multiple -A options not allowed","");
                                    cmSystemTools::Error(&local_108);
                                    paVar10 = &local_108.field_2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_108._M_dataplus._M_p != paVar10) {
                                      operator_delete(local_108._M_dataplus._M_p,
                                                      CONCAT71(local_108.field_2.
                                                               _M_allocated_capacity._1_7_,
                                                               local_108.field_2._M_local_buf[0]) +
                                                      1);
                                      paVar10 = extraout_RAX;
                                    }
                                    local_b8 = CONCAT71((int7)((ulong)paVar10 >> 8),1);
                                  }
                                  else {
                                    lVar8 = std::__cxx11::string::find((char *)psVar12,0x5479ab,0);
                                    if (lVar8 != 0) {
                                      lVar8 = std::__cxx11::string::find((char *)psVar12,0x5479e9,0)
                                      ;
                                      if (lVar8 == 0) {
                                        std::__cxx11::string::substr
                                                  ((ulong)&local_e8,(ulong)psVar12);
                                        if (local_e8._M_string_length == 0) {
                                          uVar15 = uVar15 + 1;
                                          if ((ulong)((long)(local_c8->
                                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(local_c8->
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 5)
                                              <= (ulong)uVar15) {
                                            local_108._M_dataplus._M_p = (pointer)&local_108.field_2
                                            ;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)&local_108,
                                                       "No generator specified for -G","");
                                            cmSystemTools::Error(&local_108);
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_108._M_dataplus._M_p != &local_108.field_2)
                                            {
                                              operator_delete(local_108._M_dataplus._M_p,
                                                              CONCAT71(local_108.field_2.
                                                                       _M_allocated_capacity._1_7_,
                                                                       local_108.field_2.
                                                                       _M_local_buf[0]) + 1);
                                            }
                                            PrintGeneratorList(this);
                                            goto LAB_0021d9a7;
                                          }
                                          std::__cxx11::string::_M_assign((string *)&local_e8);
                                        }
                                        gg = CreateGlobalGenerator(this,&local_e8);
                                        if (gg != (cmGlobalGenerator *)0x0) {
                                          bVar3 = true;
                                          SetGlobalGenerator(this,gg);
                                          goto LAB_0021da15;
                                        }
                                        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                                        local_108._M_string_length = 0;
                                        local_108.field_2._M_local_buf[0] = '\0';
                                        lVar8 = std::__cxx11::string::find
                                                          ((char *)&local_e8,0x5479ec,0);
                                        if (lVar8 != -1) {
                                          std::__cxx11::string::operator=
                                                    ((string *)&local_108,
                                                                                                          
                                                  "\nThe KDevelop3 generator is not supported anymore."
                                                  );
                                        }
                                        std::operator+(&local_70,"Could not create named generator "
                                                       ,&local_e8);
                                        std::operator+(&local_50,&local_70,&local_108);
                                        cmSystemTools::Error(&local_50);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_50._M_dataplus._M_p != &local_50.field_2) {
                                          operator_delete(local_50._M_dataplus._M_p,
                                                          local_50.field_2._M_allocated_capacity + 1
                                                         );
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_70._M_dataplus._M_p != &local_70.field_2) {
                                          operator_delete(local_70._M_dataplus._M_p,
                                                          local_70.field_2._M_allocated_capacity + 1
                                                         );
                                        }
                                        PrintGeneratorList(this);
                                        goto LAB_0021d98c;
                                      }
                                      SetDirectoriesFromFile(this,psVar12);
                                      goto LAB_0021da3a;
                                    }
                                    std::__cxx11::string::substr((ulong)&local_e8,(ulong)psVar12);
                                    if (local_e8._M_string_length == 0) {
                                      uVar15 = uVar15 + 1;
                                      if ((ulong)((long)(local_c8->
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(local_c8->
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 5)
                                          <= (ulong)uVar15) {
                                        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_108,
                                                   "No toolset specified for -T","");
                                        cmSystemTools::Error(&local_108);
                                        goto LAB_0021d98c;
                                      }
                                      std::__cxx11::string::_M_assign((string *)&local_e8);
                                    }
                                    if ((local_c0 & 1) == 0) {
                                      uVar11 = std::__cxx11::string::_M_assign(local_b0);
                                      this->GeneratorToolsetSet = true;
                                      bVar3 = true;
                                      local_c0 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
                                      goto LAB_0021da15;
                                    }
                                    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_108,
                                               "Multiple -T options not allowed","");
                                    cmSystemTools::Error(&local_108);
                                    paVar10 = &local_108.field_2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_108._M_dataplus._M_p != paVar10) {
                                      operator_delete(local_108._M_dataplus._M_p,
                                                      CONCAT71(local_108.field_2.
                                                               _M_allocated_capacity._1_7_,
                                                               local_108.field_2._M_local_buf[0]) +
                                                      1);
                                      paVar10 = extraout_RAX_00;
                                    }
                                    local_c0 = CONCAT71((int7)((ulong)paVar10 >> 8),1);
                                  }
LAB_0021d9a7:
                                  bVar3 = false;
                                  goto LAB_0021da15;
                                }
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,
                                           "Also check system files when warning about unused and ",
                                           0x36);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,"uninitialized variables.\n",0x19);
                                this->CheckSystemVars = true;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_0021da3a;
        }
      }
      uVar15 = uVar15 + 1;
      std::__cxx11::string::_M_assign(psVar14);
    }
LAB_0021da3a:
    if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)local_78,0,(char *)(this->GeneratorInstance)._M_string_length,0x5792ae);
      if (this->GeneratorPlatformSet == false) {
        std::__cxx11::string::_M_replace
                  ((ulong)local_a8,0,(char *)(this->GeneratorPlatform)._M_string_length,0x5792ae);
      }
      if (this->GeneratorToolsetSet == false) {
        std::__cxx11::string::_M_replace
                  ((ulong)local_b0,0,(char *)(this->GeneratorToolset)._M_string_length,0x5792ae);
      }
    }
    uVar16 = (ulong)(uVar15 + 1);
    pbVar7 = (local_c8->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_c8->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5) <= uVar16)
    goto LAB_0021e1f8;
    goto LAB_0021d4ee;
  }
LAB_0021e1f8:
  psVar12 = cmState::GetSourceDirectory_abi_cxx11_
                      ((this->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  sVar1 = psVar12->_M_string_length;
  psVar12 = cmState::GetBinaryDirectory_abi_cxx11_
                      ((this->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  sVar2 = psVar12->_M_string_length;
  if ((this->CurrentWorkingMode == NORMAL_MODE) && (sVar2 == 0 && sVar1 == 0)) {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,
               "No source or binary directory provided. Both will be assumed to be the same as the current working directory, but note that this warning will become a fatal error in future CMake releases."
               ,"");
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    cmMessenger::IssueMessage
              ((this->Messenger)._M_t.
               super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
               super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
               super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,WARNING,&local_e8,
               (cmListFileBacktrace *)&local_108);
    uVar13 = extraout_DL_00;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length);
      uVar13 = extraout_DL_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      uVar13 = extraout_DL_02;
    }
  }
  else {
    uVar13 = extraout_DL;
    if (sVar1 != 0) goto LAB_0021e2ce;
  }
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&local_e8,(SystemTools *)0x1,(bool)uVar13);
  SetHomeDirectory(this,&local_e8);
  uVar13 = extraout_DL_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    uVar13 = extraout_DL_04;
  }
LAB_0021e2ce:
  if (sVar2 == 0) {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_e8,(SystemTools *)0x1,(bool)uVar13);
    SetHomeOutputDirectory(this,&local_e8);
LAB_0021e2f9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmake::SetArgs(const std::vector<std::string>& args)
{
  bool haveToolset = false;
  bool havePlatform = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-H", 0) == 0 || arg.find("-S", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No source directory specified for -S");
          return;
        }
        path = args[i];
        if (path[0] == '-') {
          cmSystemTools::Error("No source directory specified for -S");
          return;
        }
      }

      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeDirectory(path);
    } else if (arg.find("-O", 0) == 0) {
      // There is no local generate anymore.  Ignore -O option.
    } else if (arg.find("-B", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No build directory specified for -B");
          return;
        }
        path = args[i];
        if (path[0] == '-') {
          cmSystemTools::Error("No build directory specified for -B");
          return;
        }
      }

      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeOutputDirectory(path);
    } else if ((i < args.size() - 2) &&
               (arg.find("--check-build-system", 0) == 0)) {
      this->CheckBuildSystemArgument = args[++i];
      this->ClearBuildSystem = (atoi(args[++i].c_str()) > 0);
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-file", 0) == 0)) {
      this->CheckStampFile = args[++i];
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-list", 0) == 0)) {
      this->CheckStampList = args[++i];
    }
#if defined(CMAKE_HAVE_VS_GENERATORS)
    else if ((i < args.size() - 1) &&
             (arg.find("--vs-solution-file", 0) == 0)) {
      this->VSSolutionFile = args[++i];
    }
#endif
    else if (arg.find("-D", 0) == 0) {
      // skip for now
      // in case '-D var=val' is given, also skip the next
      // in case '-Dvar=val' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-U", 0) == 0) {
      // skip for now
      // in case '-U var' is given, also skip the next
      // in case '-Uvar' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-C", 0) == 0) {
      // skip for now
      // in case '-C path' is given, also skip the next
      // in case '-Cpath' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-P", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("--find-package", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("-W", 0) == 0) {
      // skip for now
    } else if (arg.find("--graphviz=", 0) == 0) {
      std::string path = arg.substr(strlen("--graphviz="));
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->GraphVizFile = path;
      if (this->GraphVizFile.empty()) {
        cmSystemTools::Error("No file specified for --graphviz");
        return;
      }
    } else if (arg.find("--debug-trycompile", 0) == 0) {
      std::cout << "debug trycompile on\n";
      this->DebugTryCompileOn();
    } else if (arg.find("--debug-output", 0) == 0) {
      std::cout << "Running with debug output on.\n";
      this->SetDebugOutputOn(true);
    } else if (arg.find("--loglevel=", 0) == 0) {
      const auto logLevel =
        StringToLogLevel(arg.substr(sizeof("--loglevel=") - 1));
      if (logLevel == LogLevel::LOG_UNDEFINED) {
        cmSystemTools::Error("Invalid level specified for --loglevel");
        return;
      }
      this->SetLogLevel(logLevel);
    } else if (arg.find("--trace-expand", 0) == 0) {
      std::cout << "Running with expanded trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(true);
    } else if (arg.find("--trace-source=", 0) == 0) {
      std::string file = arg.substr(strlen("--trace-source="));
      cmSystemTools::ConvertToUnixSlashes(file);
      this->AddTraceSource(file);
      this->SetTrace(true);
    } else if (arg.find("--trace", 0) == 0) {
      std::cout << "Running with trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(false);
    } else if (arg.find("--warn-uninitialized", 0) == 0) {
      std::cout << "Warn about uninitialized values.\n";
      this->SetWarnUninitialized(true);
    } else if (arg.find("--warn-unused-vars", 0) == 0) {
      std::cout << "Finding unused variables.\n";
      this->SetWarnUnused(true);
    } else if (arg.find("--no-warn-unused-cli", 0) == 0) {
      std::cout << "Not searching for unused variables given on the "
                << "command line.\n";
      this->SetWarnUnusedCli(false);
    } else if (arg.find("--check-system-vars", 0) == 0) {
      std::cout << "Also check system files when warning about unused and "
                << "uninitialized variables.\n";
      this->SetCheckSystemVars(true);
    } else if (arg.find("-A", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No platform specified for -A");
          return;
        }
        value = args[i];
      }
      if (havePlatform) {
        cmSystemTools::Error("Multiple -A options not allowed");
        return;
      }
      this->SetGeneratorPlatform(value);
      havePlatform = true;
    } else if (arg.find("-T", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No toolset specified for -T");
          return;
        }
        value = args[i];
      }
      if (haveToolset) {
        cmSystemTools::Error("Multiple -T options not allowed");
        return;
      }
      this->SetGeneratorToolset(value);
      haveToolset = true;
    } else if (arg.find("-G", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return;
        }
        value = args[i];
      }
      cmGlobalGenerator* gen = this->CreateGlobalGenerator(value);
      if (!gen) {
        std::string kdevError;
        if (value.find("KDevelop3", 0) != std::string::npos) {
          kdevError = "\nThe KDevelop3 generator is not supported anymore.";
        }

        cmSystemTools::Error("Could not create named generator " + value +
                             kdevError);
        this->PrintGeneratorList();
        return;
      }
      this->SetGlobalGenerator(gen);
    }
    // no option assume it is the path to the source or an existing build
    else {
      this->SetDirectoriesFromFile(arg);
    }
    // Empty instance, platform and toolset if only a generator is specified
    if (this->GlobalGenerator) {
      this->GeneratorInstance = "";
      if (!this->GeneratorPlatformSet) {
        this->GeneratorPlatform = "";
      }
      if (!this->GeneratorToolsetSet) {
        this->GeneratorToolset = "";
      }
    }
  }